

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O1

void __thiscall TPZFileEqnStorage<long_double>::FinishWriting(TPZFileEqnStorage<long_double> *this)

{
  fseek((FILE *)this->fIOStream,4,0);
  fwrite(&this->fNumBlocks,4,1,(FILE *)this->fIOStream);
  fclose((FILE *)this->fIOStream);
  this->fIOStream = (FILE *)0x0;
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::FinishWriting()
{
#ifdef PZ_LOG
	if(logger.isDebugEnabled()) LOGPZ_DEBUG(logger,"Closing the binary file")
#endif
	fseek(fIOStream,sizeof(int),SEEK_SET);
	//cout << "Second fseek " << ftell(fIOStream) << endl;
	//fwrite(&fNumBlocks,sizeof(int),1,fIOStream);
	fwrite(&fNumBlocks,sizeof(int),1,fIOStream);
	fclose(fIOStream);
	fIOStream = 0;
}